

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O0

void DumpStateHelper(FStateLabels *StateList,FString *prefix)

{
  FStateLabels *StateList_00;
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  FString local_38;
  FString local_30;
  PClassActor *local_28;
  PClassActor *owner;
  FString *pFStack_18;
  int i;
  FString *prefix_local;
  FStateLabels *StateList_local;
  
  pFStack_18 = prefix;
  prefix_local = (FString *)StateList;
  for (owner._4_4_ = 0; owner._4_4_ < *(int *)&prefix_local->Chars; owner._4_4_ = owner._4_4_ + 1) {
    if (prefix_local[(long)owner._4_4_ * 3 + 2].Chars != (char *)0x0) {
      local_28 = FState::StaticFindStateOwner
                           ((FState *)prefix_local[(long)owner._4_4_ * 3 + 2].Chars);
      if (local_28 == (PClassActor *)0x0) {
        pcVar1 = FString::GetChars(pFStack_18);
        pcVar2 = FName::GetChars((FName *)(prefix_local + (long)owner._4_4_ * 3 + 1));
        Printf(5,"%s%s: invalid\n",pcVar1,pcVar2);
      }
      else {
        pcVar1 = FString::GetChars(pFStack_18);
        pcVar2 = FName::GetChars((FName *)(prefix_local + (long)owner._4_4_ * 3 + 1));
        pcVar3 = FName::GetChars(&(local_28->super_PClass).super_PNativeStruct.super_PStruct.
                                  super_PNamedType.TypeName);
        Printf(5,"%s%s: %s.%d\n",pcVar1,pcVar2,pcVar3,
               ((long)prefix_local[(long)owner._4_4_ * 3 + 2].Chars - (long)local_28->OwnedStates) /
               0x28 & 0xffffffff);
      }
    }
    if (prefix_local[(long)owner._4_4_ * 3 + 3].Chars != (char *)0x0) {
      StateList_00 = (FStateLabels *)prefix_local[(long)owner._4_4_ * 3 + 3].Chars;
      FString::operator+(&local_38,(char)pFStack_18);
      FName::GetChars((FName *)(prefix_local + (long)owner._4_4_ * 3 + 1));
      FString::operator+(&local_30,(char *)&local_38);
      DumpStateHelper(StateList_00,&local_30);
      FString::~FString(&local_30);
      FString::~FString(&local_38);
    }
  }
  return;
}

Assistant:

void DumpStateHelper(FStateLabels *StateList, const FString &prefix)
{
	for (int i = 0; i < StateList->NumLabels; i++)
	{
		if (StateList->Labels[i].State != NULL)
		{
			const PClassActor *owner = FState::StaticFindStateOwner(StateList->Labels[i].State);
			if (owner == NULL)
			{
				Printf(PRINT_LOG, "%s%s: invalid\n", prefix.GetChars(), StateList->Labels[i].Label.GetChars());
			}
			else
			{
				Printf(PRINT_LOG, "%s%s: %s.%d\n", prefix.GetChars(), StateList->Labels[i].Label.GetChars(),
					owner->TypeName.GetChars(), int(StateList->Labels[i].State - owner->OwnedStates));
			}
		}
		if (StateList->Labels[i].Children != NULL)
		{
			DumpStateHelper(StateList->Labels[i].Children, prefix + '.' + StateList->Labels[i].Label.GetChars());
		}
	}
}